

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MunitionDescriptor.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::MunitionDescriptor::Decode(MunitionDescriptor *this,KDataStream *stream)

{
  Descriptor::Decode(&this->super_Descriptor,stream);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Warhead);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Fuse);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Quantity);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Rate);
  return;
}

Assistant:

void MunitionDescriptor::Decode(KDataStream &stream) noexcept(false)
{
	Descriptor::Decode( stream );

    stream >> m_ui16Warhead
           >> m_ui16Fuse
           >> m_ui16Quantity
           >> m_ui16Rate;
}